

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_7::Validator::CheckBlockDeclaration
          (Validator *this,Location *loc,Opcode opcode,BlockDeclaration *decl)

{
  FuncSignature *pFVar1;
  Result RVar2;
  Info local_70;
  FuncSignature *local_48;
  FuncType *local_40;
  FuncType *func_type;
  Opcode opcode_local;
  
  func_type._4_4_ = opcode.enum_;
  if ((((long)(decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_start & 0x3fffffffcU) != 0) &&
     ((this->options_->features).multi_value_enabled_ == false)) {
    Opcode::GetInfo(&local_70,(Opcode *)((long)&func_type + 4));
    PrintError(this,loc,"%s params not currently supported.",local_70.name);
  }
  if ((((long)(decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
              _M_impl.super__Vector_impl_data._M_start & 0x3fffffff8U) != 0) &&
     ((this->options_->features).multi_value_enabled_ == false)) {
    Opcode::GetInfo(&local_70,(Opcode *)((long)&func_type + 4));
    PrintError(this,loc,"multiple %s results not currently supported.",local_70.name);
  }
  if (decl->has_func_type == true) {
    RVar2 = CheckFuncTypeVar(this,&decl->type_var,&local_40);
    if (RVar2.enum_ == Ok) {
      local_48 = &decl->sig;
      pFVar1 = &local_40->sig;
      Opcode::GetInfo(&local_70,(Opcode *)((long)&func_type + 4));
      CheckTypes(this,loc,&(decl->sig).result_types,&pFVar1->result_types,local_70.name,"result");
      Opcode::GetInfo(&local_70,(Opcode *)((long)&func_type + 4));
      CheckTypes(this,loc,&local_48->param_types,&(local_40->sig).param_types,local_70.name,
                 "argument");
    }
  }
  return;
}

Assistant:

void Validator::CheckBlockDeclaration(const Location* loc,
                                      Opcode opcode,
                                      const BlockDeclaration* decl) {
  if (decl->sig.GetNumParams() > 0 &&
      !options_.features.multi_value_enabled()) {
    PrintError(loc, "%s params not currently supported.", opcode.GetName());
  }
  if (decl->sig.GetNumResults() > 1 &&
      !options_.features.multi_value_enabled()) {
    PrintError(loc, "multiple %s results not currently supported.",
               opcode.GetName());
  }
  if (decl->has_func_type) {
    const FuncType* func_type;
    if (Succeeded(CheckFuncTypeVar(&decl->type_var, &func_type))) {
      CheckTypes(loc, decl->sig.result_types, func_type->sig.result_types,
                 opcode.GetName(), "result");
      CheckTypes(loc, decl->sig.param_types, func_type->sig.param_types,
                 opcode.GetName(), "argument");
    }
  }
}